

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mips.c
# Opt level: O3

int main(void)

{
  int iVar1;
  uint8_t *buffer;
  uchar *str;
  cs_detail *pcVar2;
  cs_err cVar3;
  cs_insn *in_RAX;
  size_t count;
  char *pcVar4;
  size_t len;
  size_t len_00;
  long *plVar5;
  char *__format;
  int i;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  cs_insn *insn;
  cs_insn *local_38;
  
  lVar6 = 0;
  local_38 = in_RAX;
  do {
    cVar3 = cs_open(CS_ARCH_MIPS,(&DAT_0025c484)[lVar6 * 8],&handle);
    if (cVar3 == CS_ERR_OK) {
      cs_option(handle,CS_OPT_DETAIL,3);
      buffer = (&PTR_anon_var_dwarf_27_0025c488)[lVar6 * 4];
      str = (uchar *)(&DAT_0025c490)[lVar6 * 4];
      count = cs_disasm(handle,buffer,(size_t)str,0x1000,0,&local_38);
      if (count == 0) {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_0025c498)[lVar6 * 4]);
        print_string_hex((char *)buffer,str,len_00);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_0025c498)[lVar6 * 4]);
        print_string_hex((char *)buffer,str,len);
        puts("Disasm:");
        sVar7 = 0;
        do {
          printf("0x%lx:\t%s\t%s\n",local_38[sVar7].address,local_38[sVar7].mnemonic,
                 local_38[sVar7].op_str);
          pcVar2 = local_38[sVar7].detail;
          if (pcVar2 != (cs_detail *)0x0) {
            if (((pcVar2->field_6).x86.prefix[0] != '\0') &&
               (printf("\top_count: %u\n"), (pcVar2->field_6).x86.prefix[0] != '\0')) {
              plVar5 = (long *)((long)&pcVar2->field_6 + 0x18);
              uVar8 = 0;
              do {
                iVar1 = (int)plVar5[-2];
                if (iVar1 == 3) {
                  printf("\t\toperands[%u].type: MEM\n",uVar8 & 0xffffffff);
                  if (*(uint *)(plVar5 + -1) != 0) {
                    pcVar4 = cs_reg_name(handle,*(uint *)(plVar5 + -1));
                    printf("\t\t\toperands[%u].mem.base: REG = %s\n",uVar8 & 0xffffffff,pcVar4);
                  }
                  pcVar4 = (char *)*plVar5;
                  if (pcVar4 != (char *)0x0) {
                    __format = "\t\t\toperands[%u].mem.disp: 0x%lx\n";
                    goto LAB_00143401;
                  }
                }
                else {
                  if (iVar1 == 2) {
                    pcVar4 = (char *)plVar5[-1];
                    __format = "\t\toperands[%u].type: IMM = 0x%lx\n";
                  }
                  else {
                    if (iVar1 != 1) goto LAB_00143408;
                    pcVar4 = cs_reg_name(handle,*(uint *)(plVar5 + -1));
                    __format = "\t\toperands[%u].type: REG = %s\n";
                  }
LAB_00143401:
                  printf(__format,uVar8 & 0xffffffff,pcVar4);
                }
LAB_00143408:
                uVar8 = uVar8 + 1;
                plVar5 = plVar5 + 3;
              } while (uVar8 < (pcVar2->field_6).x86.prefix[0]);
            }
            putchar(10);
          }
          sVar7 = sVar7 + 1;
        } while (sVar7 != count);
        printf("0x%lx:\n",(ulong)local_38[count - 1].size + local_38[count - 1].address);
        cs_free(local_38,count);
      }
      putchar(10);
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar3);
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
	test();

	return 0;
}